

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O0

bool __thiscall
cmGeneratorExpressionDAGChecker::EvaluatingGenexExpression(cmGeneratorExpressionDAGChecker *this)

{
  size_t sVar1;
  string_view str;
  string_view str_00;
  bool bVar2;
  char *extraout_RDX;
  char *extraout_RDX_00;
  bool local_31;
  cmGeneratorExpressionDAGChecker *this_local;
  
  sVar1 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->Property);
  str_00._M_str = extraout_RDX;
  str_00._M_len = sVar1;
  bVar2 = cmHasLiteralPrefix<19ul>(str_00,(char (*) [19])"TARGET_GENEX_EVAL:");
  local_31 = true;
  if (!bVar2) {
    sVar1 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->Property);
    str._M_str = extraout_RDX_00;
    str._M_len = sVar1;
    local_31 = cmHasLiteralPrefix<12ul>(str,(char (*) [12])0x103352d);
  }
  return local_31;
}

Assistant:

bool cmGeneratorExpressionDAGChecker::EvaluatingGenexExpression() const
{
  return cmHasLiteralPrefix(this->Property, "TARGET_GENEX_EVAL:") ||
    cmHasLiteralPrefix(this->Property, "GENEX_EVAL:");
}